

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.cpp
# Opt level: O2

void __thiscall WorkQueue::WorkQueue(WorkQueue *this,size_t workerCount,size_t memoryLimit)

{
  bool bVar1;
  _Bind<void_(*(std::reference_wrapper<BlockingQueue<std::function<void_()>_>_>))(BlockingQueue<std::function<void_()>_>_&)>
  local_38;
  
  BlockingQueue<std::function<void_()>_>::BlockingQueue(&this->queue,memoryLimit);
  (this->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while (bVar1 = workerCount != 0, workerCount = workerCount - 1, bVar1) {
    local_38._M_f = workerThreadFun;
    local_38._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<BlockingQueue<std::function<void_()>_>_>_>.
    super__Head_base<0UL,_std::reference_wrapper<BlockingQueue<std::function<void_()>_>_>,_false>.
    _M_head_impl._M_data =
         (_Tuple_impl<0UL,_std::reference_wrapper<BlockingQueue<std::function<void_()>_>_>_>)
         (_Tuple_impl<0UL,_std::reference_wrapper<BlockingQueue<std::function<void_()>_>_>_>)this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<std::_Bind<void(*(std::reference_wrapper<BlockingQueue<std::function<void()>>>))(BlockingQueue<std::function<void()>>&)>>
              ((vector<std::thread,std::allocator<std::thread>> *)&this->workers,&local_38);
  }
  return;
}

Assistant:

WorkQueue::WorkQueue(size_t workerCount, size_t memoryLimit): queue(memoryLimit)
{
	for (size_t i = 0; i < workerCount; ++i)
		workers.emplace_back(std::bind(workerThreadFun, std::ref(queue)));
}